

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExporter.cpp
# Opt level: O0

void __thiscall
Assimp::FBXExporter::WriteAnimationCurve
          (FBXExporter *this,StreamWriterLE *outstream,double default_value,
          vector<long,_std::allocator<long>_> *times,vector<float,_std::allocator<float>_> *values,
          int64_t curvenode_uid,string *property_link)

{
  initializer_list<int> __l;
  initializer_list<float> __l_00;
  initializer_list<int> __l_01;
  int64_t value;
  size_type sVar1;
  allocator<int> local_2f5;
  int local_2f4;
  iterator local_2f0;
  size_type local_2e8;
  vector<int,_std::allocator<int>_> local_2e0;
  allocator<char> local_2c1;
  string local_2c0;
  allocator<float> local_299;
  float local_298 [4];
  iterator local_288;
  size_type local_280;
  vector<float,_std::allocator<float>_> local_278;
  allocator<char> local_259;
  string local_258;
  allocator<int> local_235;
  int local_234;
  iterator local_230;
  size_type local_228;
  vector<int,_std::allocator<int>_> local_220;
  allocator<char> local_201;
  string local_200;
  vector<float,_std::allocator<float>_> local_1e0;
  allocator<char> local_1c1;
  string local_1c0;
  vector<long,_std::allocator<long>_> local_1a0;
  allocator<char> local_181;
  string local_180;
  allocator<char> local_159;
  string local_158;
  allocator<char> local_131;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  int64_t local_f0;
  int64_t curve_uid;
  allocator<char> local_d1;
  string local_d0;
  undefined1 local_b0 [8];
  Node n;
  string *property_link_local;
  int64_t curvenode_uid_local;
  vector<float,_std::allocator<float>_> *values_local;
  vector<long,_std::allocator<long>_> *times_local;
  double default_value_local;
  StreamWriterLE *outstream_local;
  FBXExporter *this_local;
  
  n.property_start = (size_t)property_link;
  property_link_local = (string *)curvenode_uid;
  curvenode_uid_local = (int64_t)values;
  values_local = (vector<float,_std::allocator<float>_> *)times;
  times_local = (vector<long,_std::allocator<long>_> *)default_value;
  default_value_local = (double)outstream;
  outstream_local = (StreamWriterLE *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"AnimationCurve",&local_d1)
  ;
  FBX::Node::Node((Node *)local_b0,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  value = generate_uid(this);
  local_f0 = value;
  std::operator+(&local_110,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 FBX::SEPARATOR_abi_cxx11_,"AnimCurve");
  FBX::Node::AddProperties<long,std::__cxx11::string,char_const*>
            ((Node *)local_b0,value,&local_110,"");
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"Default",&local_131);
  FBX::Node::AddChild<double>((Node *)local_b0,&local_130,(double)times_local);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator(&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"KeyVer",&local_159);
  FBX::Node::AddChild<int>((Node *)local_b0,&local_158,0xfa9);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"KeyTime",&local_181);
  std::vector<long,_std::allocator<long>_>::vector
            (&local_1a0,(vector<long,_std::allocator<long>_> *)values_local);
  FBX::Node::AddChild<std::vector<long,std::allocator<long>>>
            ((Node *)local_b0,&local_180,&local_1a0);
  std::vector<long,_std::allocator<long>_>::~vector(&local_1a0);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator(&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,"KeyValueFloat",&local_1c1);
  std::vector<float,_std::allocator<float>_>::vector
            (&local_1e0,(vector<float,_std::allocator<float>_> *)curvenode_uid_local);
  FBX::Node::AddChild<std::vector<float,std::allocator<float>>>
            ((Node *)local_b0,&local_1c0,&local_1e0);
  std::vector<float,_std::allocator<float>_>::~vector(&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_200,"KeyAttrFlags",&local_201)
  ;
  local_234 = 0;
  local_230 = &local_234;
  local_228 = 1;
  std::allocator<int>::allocator(&local_235);
  __l_01._M_len = local_228;
  __l_01._M_array = local_230;
  std::vector<int,_std::allocator<int>_>::vector(&local_220,__l_01,&local_235);
  FBX::Node::AddChild<std::vector<int,std::allocator<int>>>((Node *)local_b0,&local_200,&local_220);
  std::vector<int,_std::allocator<int>_>::~vector(&local_220);
  std::allocator<int>::~allocator(&local_235);
  std::__cxx11::string::~string((string *)&local_200);
  std::allocator<char>::~allocator(&local_201);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,"KeyAttrDataFloat",&local_259);
  local_298[0] = 0.0;
  local_298[1] = 0.0;
  local_298[2] = 0.0;
  local_298[3] = 0.0;
  local_288 = local_298;
  local_280 = 4;
  std::allocator<float>::allocator(&local_299);
  __l_00._M_len = local_280;
  __l_00._M_array = local_288;
  std::vector<float,_std::allocator<float>_>::vector(&local_278,__l_00,&local_299);
  FBX::Node::AddChild<std::vector<float,std::allocator<float>>>
            ((Node *)local_b0,&local_258,&local_278);
  std::vector<float,_std::allocator<float>_>::~vector(&local_278);
  std::allocator<float>::~allocator(&local_299);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator(&local_259);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c0,"KeyAttrRefCount",&local_2c1);
  sVar1 = std::vector<long,_std::allocator<long>_>::size
                    ((vector<long,_std::allocator<long>_> *)values_local);
  local_2f4 = (int)sVar1;
  local_2f0 = &local_2f4;
  local_2e8 = 1;
  std::allocator<int>::allocator(&local_2f5);
  __l._M_len = local_2e8;
  __l._M_array = local_2f0;
  std::vector<int,_std::allocator<int>_>::vector(&local_2e0,__l,&local_2f5);
  FBX::Node::AddChild<std::vector<int,std::allocator<int>>>((Node *)local_b0,&local_2c0,&local_2e0);
  std::vector<int,_std::allocator<int>_>::~vector(&local_2e0);
  std::allocator<int>::~allocator(&local_2f5);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::allocator<char>::~allocator(&local_2c1);
  FBX::Node::Dump((Node *)local_b0,(StreamWriterLE *)default_value_local,(bool)(this->binary & 1),1)
  ;
  std::vector<Assimp::FBX::Node,std::allocator<Assimp::FBX::Node>>::
  emplace_back<char_const(&)[2],char_const(&)[3],long&,long&,std::__cxx11::string_const&>
            ((vector<Assimp::FBX::Node,std::allocator<Assimp::FBX::Node>> *)&this->connections,
             (char (*) [2])0xbab3fd,(char (*) [3])"OP",&local_f0,(long *)&property_link_local,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)n.property_start);
  FBX::Node::~Node((Node *)local_b0);
  return;
}

Assistant:

void FBXExporter::WriteAnimationCurve(
    StreamWriterLE& outstream,
    double default_value,
    const std::vector<int64_t>& times,
    const std::vector<float>& values,
    int64_t curvenode_uid,
    const std::string& property_link // "d|X", "d|Y", etc
) {
    FBX::Node n("AnimationCurve");
    int64_t curve_uid = generate_uid();
    n.AddProperties(curve_uid, FBX::SEPARATOR + "AnimCurve", "");
    n.AddChild("Default", default_value);
    n.AddChild("KeyVer", int32_t(4009));
    n.AddChild("KeyTime", times);
    n.AddChild("KeyValueFloat", values);
    // TODO: keyattr flags and data (STUB for now)
    n.AddChild("KeyAttrFlags", std::vector<int32_t>{0});
    n.AddChild("KeyAttrDataFloat", std::vector<float>{0,0,0,0});
    n.AddChild(
        "KeyAttrRefCount",
        std::vector<int32_t>{static_cast<int32_t>(times.size())}
    );
    n.Dump(outstream, binary, 1);
    this->connections.emplace_back(
        "C", "OP", curve_uid, curvenode_uid, property_link
    );
}